

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundConfigTab.cpp
# Opt level: O1

void __thiscall SoundConfigTab::apply(SoundConfigTab *this,SoundConfig *soundConfig)

{
  int iVar1;
  
  iVar1 = QComboBox::currentIndex();
  SoundConfig::setBackendIndex(soundConfig,iVar1);
  iVar1 = QComboBox::currentIndex();
  SoundConfig::setDeviceIndex(soundConfig,iVar1);
  iVar1 = QComboBox::currentIndex();
  SoundConfig::setSamplerateIndex(soundConfig,iVar1);
  iVar1 = QSpinBox::value();
  SoundConfig::setLatency(soundConfig,iVar1);
  iVar1 = QSpinBox::value();
  SoundConfig::setPeriod(soundConfig,iVar1);
  ConfigTab::clean(&this->super_ConfigTab);
  return;
}

Assistant:

void SoundConfigTab::apply(SoundConfig &soundConfig) {
    soundConfig.setBackendIndex(mAudioGroup->mApiCombo->currentIndex());
    soundConfig.setDeviceIndex(mAudioGroup->mDeviceCombo->currentIndex());
    soundConfig.setSamplerateIndex(mSamplerateCombo->currentIndex());

    soundConfig.setLatency(mLatencySpin->value());
    soundConfig.setPeriod(mPeriodSpin->value());

    clean();
}